

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O2

void opus_fft_free(kiss_fft_state *cfg,int arch)

{
  if (cfg != (kiss_fft_state *)0x0) {
    free(cfg->bitrev);
    if (cfg->shift < 0) {
      free(cfg->twiddles);
    }
    free(cfg);
    return;
  }
  return;
}

Assistant:

void opus_fft_free(const kiss_fft_state *cfg, int arch) {
    if (cfg) {
        opus_fft_free_arch((kiss_fft_state *) cfg, arch);
        opus_free((opus_int16 *) cfg->bitrev);
        if (cfg->shift < 0)
            opus_free((kiss_twiddle_cpx *) cfg->twiddles);
        opus_free((kiss_fft_state *) cfg);
    }
}